

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O0

SampledSpectrum __thiscall
pbrt::MLTIntegrator::L
          (MLTIntegrator *this,ScratchBuffer *scratchBuffer,MLTSampler *sampler,int depth,
          Point2f *pRaster,SampledWavelengths *lambda)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  array<float,_4> aVar5;
  bool bVar6;
  int iVar7;
  int *piVar8;
  Array this_00;
  float *pfVar9;
  Array this_01;
  Tuple2<pbrt::Point2,_float> *pTVar10;
  int in_ECX;
  MLTSampler *in_RDX;
  time_t *__timer;
  long in_RDI;
  Tuple2<pbrt::Point2,_float> *in_R8;
  undefined8 *in_R9;
  Float FVar11;
  undefined1 auVar18 [12];
  undefined1 auVar13 [16];
  double dVar12;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined1 extraout_var [56];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  ulong uVar23;
  undefined1 in_ZMM1 [64];
  undefined1 auVar22 [64];
  Bounds2f BVar25;
  SampledSpectrum SVar26;
  bool in_stack_0000012f;
  Float in_stack_00000130;
  int in_stack_00000134;
  ScratchBuffer *in_stack_00000138;
  CameraHandle *in_stack_00000140;
  SamplerHandle *in_stack_00000148;
  SampledWavelengths *in_stack_00000150;
  Integrator *in_stack_00000158;
  LightSamplerHandle *in_stack_00000170;
  undefined8 in_stack_00000178;
  optional<pbrt::Point2<float>_> pRasterNew;
  Vertex *lightVertices;
  Float rayDiffScale;
  optional<pbrt::CameraRayDifferential> crd;
  CameraSample cameraSample;
  Bounds2f sampleBounds;
  Vertex *cameraVertices;
  int nStrategies;
  int t;
  int s;
  SampledSpectrum L;
  int in_stack_000009b0;
  int in_stack_000009b4;
  Vertex *in_stack_000009b8;
  Vertex *in_stack_000009c0;
  SampledWavelengths *in_stack_000009c8;
  Integrator *in_stack_000009d0;
  LightSamplerHandle *in_stack_000009f0;
  CameraHandle *in_stack_000009f8;
  SamplerHandle *in_stack_00000a00;
  optional<pbrt::Point2<float>_> *in_stack_00000a08;
  Float *in_stack_00000a10;
  MLTSampler *in_stack_fffffffffffffcb8;
  MLTSampler *pMVar27;
  MLTSampler *in_stack_fffffffffffffcc0;
  SampledSpectrum *this_02;
  MLTSampler *in_stack_fffffffffffffcc8;
  undefined4 uVar28;
  size_t n;
  ScratchBuffer *in_stack_fffffffffffffcd0;
  SampledWavelengths *in_stack_fffffffffffffcd8;
  CameraSample *in_stack_fffffffffffffce0;
  CameraHandle *in_stack_fffffffffffffce8;
  SampledSpectrum local_1f0;
  undefined8 local_1dc;
  undefined8 local_1d4;
  Float in_stack_fffffffffffffe3c;
  RayDifferential *in_stack_fffffffffffffe40;
  undefined1 local_1a0 [20];
  float local_18c;
  float local_188;
  float local_184;
  int local_180;
  optional local_170 [120];
  ScratchBuffer *local_f8;
  Tuple2<pbrt::Point2,_float> TVar29;
  ScratchBuffer *scratchBuffer_00;
  undefined4 in_stack_ffffffffffffff24;
  SampledWavelengths *lambda_00;
  Tuple2<pbrt::Point2,_float> ray;
  Integrator *in_stack_ffffffffffffff38;
  Array this_03;
  Vertex *in_stack_ffffffffffffff58;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 local_74;
  undefined8 local_6c;
  undefined8 local_64;
  undefined8 local_5c;
  int local_54;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  undefined8 *local_40;
  Tuple2<pbrt::Point2,_float> *local_38;
  int local_2c;
  MLTSampler *local_28;
  undefined8 local_10;
  undefined8 local_8;
  undefined1 auVar21 [56];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  undefined1 auVar24 [56];
  
  auVar24 = in_ZMM1._8_56_;
  local_40 = in_R9;
  local_38 = in_R8;
  local_2c = in_ECX;
  local_28 = in_RDX;
  MLTSampler::StartStream(in_RDX,0);
  uVar23 = auVar24._0_8_;
  if (local_2c == 0) {
    local_4c = 1;
    local_44 = 0;
    local_48 = 2;
  }
  else {
    local_4c = local_2c + 2;
    FVar11 = MLTSampler::Get1D(in_stack_fffffffffffffcc0);
    auVar24 = ZEXT856(uVar23);
    local_50 = (int)(FVar11 * (float)local_4c);
    local_54 = local_4c + -1;
    piVar8 = std::min<int>(&local_50,&local_54);
    local_44 = *piVar8;
    local_48 = local_4c - local_44;
  }
  if ((*(byte *)(Options + 0xd) & 1) == 0) {
    CameraHandle::GetFilm((CameraHandle *)in_stack_fffffffffffffcc8);
    MLTSampler::Get1D(in_stack_fffffffffffffcc0);
    auVar21 = extraout_var;
    FilmHandle::SampleWavelengths
              ((FilmHandle *)in_stack_fffffffffffffcd0,
               (Float)((ulong)in_stack_fffffffffffffcc8 >> 0x20));
    *local_40 = local_a0;
    local_40[1] = local_98;
    local_40[2] = local_90;
    local_40[3] = local_88;
  }
  else {
    CameraHandle::GetFilm((CameraHandle *)in_stack_fffffffffffffcc8);
    auVar21 = (undefined1  [56])0x0;
    FilmHandle::SampleWavelengths
              ((FilmHandle *)in_stack_fffffffffffffcd0,
               (Float)((ulong)in_stack_fffffffffffffcc8 >> 0x20));
    *local_40 = local_74;
    local_40[1] = local_6c;
    local_40[2] = local_64;
    local_40[3] = local_5c;
  }
  this_00 = ScratchBuffer::Alloc<pbrt::Vertex[]>
                      (in_stack_fffffffffffffcd0,(size_t)in_stack_fffffffffffffcc8);
  CameraHandle::GetFilm((CameraHandle *)in_stack_fffffffffffffcc8);
  BVar25 = FilmHandle::SampleBounds((FilmHandle *)in_stack_fffffffffffffcc0);
  auVar22._0_8_ = BVar25.pMax.super_Tuple2<pbrt::Point2,_float>;
  auVar22._8_56_ = auVar24;
  auVar14._0_8_ = BVar25.pMin.super_Tuple2<pbrt::Point2,_float>;
  auVar14._8_56_ = auVar21;
  vmovlpd_avx(auVar14._0_16_);
  vmovlpd_avx(auVar22._0_16_);
  auVar15._0_8_ = MLTSampler::Get2D(in_stack_fffffffffffffcc8);
  auVar15._8_56_ = extraout_var_00;
  lambda_00 = (SampledWavelengths *)vmovlpd_avx(auVar15._0_16_);
  auVar16._0_8_ =
       Bounds2<float>::Lerp
                 ((Bounds2<float> *)in_stack_fffffffffffffcc8,(Point2f *)in_stack_fffffffffffffcc0);
  auVar16._8_56_ = extraout_var_01;
  ray = (Tuple2<pbrt::Point2,_float>)vmovlpd_avx(auVar16._0_16_);
  *local_38 = ray;
  CameraSample::CameraSample((CameraSample *)in_stack_fffffffffffffcc0);
  TVar29 = *local_38;
  FVar11 = MLTSampler::Get1D(in_stack_fffffffffffffcc0);
  auVar17._0_8_ = MLTSampler::Get2D(in_stack_fffffffffffffcc8);
  auVar17._8_56_ = extraout_var_02;
  local_f8 = (ScratchBuffer *)vmovlpd_avx(auVar17._0_16_);
  scratchBuffer_00 = local_f8;
  CameraHandle::GenerateRayDifferential
            (in_stack_fffffffffffffce8,in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
  auVar18 = auVar17._4_12_;
  bVar6 = pstd::optional::operator_cast_to_bool(local_170);
  if (bVar6) {
    pstd::optional<pbrt::CameraRayDifferential>::operator->
              ((optional<pbrt::CameraRayDifferential> *)0x7a911a);
    bVar6 = SampledSpectrum::operator_cast_to_bool((SampledSpectrum *)in_stack_fffffffffffffcc8);
    uVar28 = (undefined4)((ulong)in_stack_fffffffffffffcc8 >> 0x20);
    if (bVar6) {
      local_188 = 0.125;
      iVar7 = MLTSampler::SamplesPerPixel(local_28);
      auVar13._0_4_ = (float)iVar7;
      auVar13._4_12_ = auVar18;
      dVar12 = std::sqrt(auVar13._0_8_);
      uVar20 = 0;
      local_18c = 1.0 / SUB84(dVar12,0);
      pfVar9 = std::max<float>(&local_188,&local_18c);
      local_184 = *pfVar9;
      pstd::optional<pbrt::CameraRayDifferential>::operator->
                ((optional<pbrt::CameraRayDifferential> *)0x7a9222);
      RayDifferential::ScaleDifferentials(in_stack_fffffffffffffe40,in_stack_fffffffffffffe3c);
      pstd::optional<pbrt::CameraRayDifferential>::operator->
                ((optional<pbrt::CameraRayDifferential> *)0x7a9251);
      SamplerHandle::TaggedPointer<pbrt::MLTSampler>
                ((SamplerHandle *)in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
      CameraHandle::CameraHandle
                ((CameraHandle *)in_stack_fffffffffffffcc0,(CameraHandle *)in_stack_fffffffffffffcb8
                );
      n = CONCAT44(uVar28,(uint)*(byte *)(in_RDI + 0x60)) & 0xffffffff00000001;
      pMVar27 = (MLTSampler *)local_1a0;
      this_03 = this_00;
      iVar7 = GenerateCameraSubpath
                        (in_stack_ffffffffffffff38,(RayDifferential *)ray,lambda_00,
                         (SamplerHandle *)CONCAT44(in_stack_ffffffffffffff24,FVar11),
                         scratchBuffer_00,(int)TVar29.y,(CameraHandle *)this_00,
                         in_stack_ffffffffffffff58,TVar29.x._3_1_);
      if (iVar7 == local_48) {
        MLTSampler::StartStream(local_28,1);
        this_01 = ScratchBuffer::Alloc<pbrt::Vertex[]>(in_stack_fffffffffffffcd0,n);
        SamplerHandle::TaggedPointer<pbrt::MLTSampler>((SamplerHandle *)this_00,pMVar27);
        __timer = (time_t *)(in_RDI + 0x68);
        CameraHandle::CameraHandle((CameraHandle *)this_00,(CameraHandle *)pMVar27);
        Vertex::time(this_03,__timer);
        LightSamplerHandle::LightSamplerHandle
                  ((LightSamplerHandle *)this_00,(LightSamplerHandle *)pMVar27);
        uVar19 = 0;
        pMVar27 = (MLTSampler *)&stack0xfffffffffffffe40;
        iVar7 = GenerateLightSubpath
                          (in_stack_00000158,in_stack_00000150,in_stack_00000148,in_stack_00000140,
                           in_stack_00000138,in_stack_00000134,in_stack_00000130,in_stack_00000170,
                           (Vertex *)in_stack_00000178,in_stack_0000012f);
        if (iVar7 == local_44) {
          MLTSampler::StartStream(local_28,2);
          pstd::optional<pbrt::Point2<float>_>::optional
                    ((optional<pbrt::Point2<float>_> *)&stack0xfffffffffffffe34);
          LightSamplerHandle::LightSamplerHandle
                    ((LightSamplerHandle *)this_01,(LightSamplerHandle *)pMVar27);
          CameraHandle::CameraHandle((CameraHandle *)this_01,(CameraHandle *)pMVar27);
          SamplerHandle::TaggedPointer<pbrt::MLTSampler>((SamplerHandle *)this_01,pMVar27);
          this_02 = &local_1f0;
          FVar11 = (Float)((ulong)(local_1f0.values.values + 2) >> 0x20);
          SVar26 = ConnectBDPT(in_stack_000009d0,in_stack_000009c8,in_stack_000009c0,
                               in_stack_000009b8,in_stack_000009b4,in_stack_000009b0,
                               in_stack_000009f0,in_stack_000009f8,in_stack_00000a00,
                               in_stack_00000a08,in_stack_00000a10);
          auVar3._8_8_ = uVar20;
          auVar3._0_8_ = SVar26.values.values._8_8_;
          auVar4._8_8_ = uVar19;
          auVar4._0_8_ = SVar26.values.values._0_8_;
          local_1dc = vmovlpd_avx(auVar4);
          local_1d4 = vmovlpd_avx(auVar3);
          SVar26 = SampledSpectrum::operator*(this_02,FVar11);
          auVar1._8_8_ = uVar19;
          auVar1._0_8_ = SVar26.values.values._8_8_;
          auVar2._8_8_ = uVar20;
          auVar2._0_8_ = SVar26.values.values._0_8_;
          local_10 = vmovlpd_avx(auVar2);
          local_8 = vmovlpd_avx(auVar1);
          bVar6 = pstd::optional<pbrt::Point2<float>_>::has_value
                            ((optional<pbrt::Point2<float>_> *)&stack0xfffffffffffffe34);
          if (bVar6) {
            pTVar10 = &pstd::optional<pbrt::Point2<float>_>::operator*
                                 ((optional<pbrt::Point2<float>_> *)0x7a9698)->
                       super_Tuple2<pbrt::Point2,_float>;
            *local_38 = *pTVar10;
          }
          local_180 = 1;
          pstd::optional<pbrt::Point2<float>_>::~optional
                    ((optional<pbrt::Point2<float>_> *)0x7a96ef);
        }
        else {
          SampledSpectrum::SampledSpectrum
                    ((SampledSpectrum *)this_01,(Float)((ulong)pMVar27 >> 0x20));
          local_180 = 1;
        }
      }
      else {
        SampledSpectrum::SampledSpectrum((SampledSpectrum *)this_00,(Float)((ulong)pMVar27 >> 0x20))
        ;
        local_180 = 1;
      }
      goto LAB_007a96ef;
    }
  }
  SampledSpectrum::SampledSpectrum
            ((SampledSpectrum *)in_stack_fffffffffffffcc0,
             (Float)((ulong)in_stack_fffffffffffffcb8 >> 0x20));
  local_180 = 1;
LAB_007a96ef:
  pstd::optional<pbrt::CameraRayDifferential>::~optional
            ((optional<pbrt::CameraRayDifferential> *)0x7a96fc);
  aVar5.values[2] = (float)(undefined4)local_8;
  aVar5.values[3] = (float)local_8._4_4_;
  aVar5.values[0] = (float)(undefined4)local_10;
  aVar5.values[1] = (float)local_10._4_4_;
  return (array<float,_4>)(array<float,_4>)aVar5.values;
}

Assistant:

SampledSpectrum MLTIntegrator::L(ScratchBuffer &scratchBuffer, MLTSampler &sampler,
                                 int depth, Point2f *pRaster,
                                 SampledWavelengths *lambda) {
    sampler.StartStream(cameraStreamIndex);
    // Determine the number of available strategies and pick a specific one
    int s, t, nStrategies;
    if (depth == 0) {
        nStrategies = 1;
        s = 0;
        t = 2;
    } else {
        nStrategies = depth + 2;
        s = std::min<int>(sampler.Get1D() * nStrategies, nStrategies - 1);
        t = nStrategies - s;
    }

    // Sample wavelengths for MLT path
    if (Options->disableWavelengthJitter)
        *lambda = camera.GetFilm().SampleWavelengths(0.5);
    else
        *lambda = camera.GetFilm().SampleWavelengths(sampler.Get1D());

    // Generate a camera subpath with exactly _t_ vertices
    Vertex *cameraVertices = scratchBuffer.Alloc<Vertex[]>(t);
    Bounds2f sampleBounds = camera.GetFilm().SampleBounds();
    *pRaster = sampleBounds.Lerp(sampler.Get2D());
    CameraSample cameraSample;
    cameraSample.pFilm = *pRaster;
    cameraSample.time = sampler.Get1D();
    cameraSample.pLens = sampler.Get2D();
    pstd::optional<CameraRayDifferential> crd =
        camera.GenerateRayDifferential(cameraSample, *lambda);
    if (!crd || !crd->weight)
        return SampledSpectrum(0.f);
    Float rayDiffScale =
        std::max<Float>(.125, 1 / std::sqrt((Float)sampler.SamplesPerPixel()));
    crd->ray.ScaleDifferentials(rayDiffScale);

    if (GenerateCameraSubpath(*this, crd->ray, *lambda, &sampler, scratchBuffer, t,
                              camera, cameraVertices, regularize) != t)
        return SampledSpectrum(0.f);

    // Generate a light subpath with exactly _s_ vertices
    sampler.StartStream(lightStreamIndex);
    Vertex *lightVertices = scratchBuffer.Alloc<Vertex[]>(s);
    if (GenerateLightSubpath(*this, *lambda, &sampler, camera, scratchBuffer, s,
                             cameraVertices[0].time(), lightSampler, lightVertices,
                             regularize) != s)
        return SampledSpectrum(0.f);

    // Execute connection strategy and return the radiance estimate
    sampler.StartStream(connectionStreamIndex);
    pstd::optional<Point2f> pRasterNew;
    SampledSpectrum L = ConnectBDPT(*this, *lambda, lightVertices, cameraVertices, s, t,
                                    lightSampler, camera, &sampler, &pRasterNew) *
                        nStrategies;
    if (pRasterNew.has_value())
        *pRaster = *pRasterNew;
    return L;
}